

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall
cmCTestBuildHandler::LaunchHelper::LaunchHelper(LaunchHelper *this,cmCTestBuildHandler *handler)

{
  string *source;
  cmCTest *this_00;
  cmCTestBuildHandler *pcVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string launchEnv;
  string tag;
  string local_c0;
  string local_a0;
  string local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  undefined8 local_30;
  char *local_28;
  
  this->Handler = handler;
  this_00 = (handler->super_cmCTestGenericHandler).CTest;
  this->CTest = this_00;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_80,this_00);
  pcVar1 = this->Handler;
  if (local_80._M_string_length == 0) {
    pcVar1->UseCTestLaunch = false;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_(&local_a0,this->CTest);
    local_60._M_len = local_a0._M_string_length;
    local_60._M_str = local_a0._M_dataplus._M_p;
    local_50 = 9;
    local_48 = "/Testing/";
    local_40 = local_80._M_string_length;
    local_38 = local_80._M_dataplus._M_p;
    local_30 = 6;
    local_28 = "/Build";
    views._M_len = 4;
    views._M_array = &local_60;
    cmCatViews_abi_cxx11_(&local_c0,views);
    source = &pcVar1->CTestLaunchDir;
    std::__cxx11::string::operator=((string *)source,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::RemoveADirectory(source);
    if (this->Handler->UseCTestLaunch == true) {
      cmsys::SystemTools::MakeDirectory(source,(mode_t *)0x0);
      WriteLauncherConfig(this);
      local_48 = (pcVar1->CTestLaunchDir)._M_dataplus._M_p;
      local_50 = (pcVar1->CTestLaunchDir)._M_string_length;
      local_60._M_len = 0x12;
      local_60._M_str = "CTEST_LAUNCH_LOGS=";
      views_00._M_len = 2;
      views_00._M_array = &local_60;
      cmCatViews_abi_cxx11_(&local_c0,views_00);
      cmsys::SystemTools::PutEnv(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (this->Handler->UseCTestLaunch == false) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCTestBuildHandler::LaunchHelper::LaunchHelper(cmCTestBuildHandler* handler)
  : Handler(handler)
  , CTest(handler->CTest)
{
  std::string tag = this->CTest->GetCurrentTag();
  if (tag.empty()) {
    // This is not for a dashboard submission, so there is no XML.
    // Skip enabling the launchers.
    this->Handler->UseCTestLaunch = false;
  } else {
    // Compute a directory in which to store launcher fragments.
    std::string& launchDir = this->Handler->CTestLaunchDir;
    launchDir =
      cmStrCat(this->CTest->GetBinaryDir(), "/Testing/", tag, "/Build");

    // Clean out any existing launcher fragments.
    cmSystemTools::RemoveADirectory(launchDir);

    if (this->Handler->UseCTestLaunch) {
      // Enable launcher fragments.
      cmSystemTools::MakeDirectory(launchDir);
      this->WriteLauncherConfig();
      std::string launchEnv = cmStrCat("CTEST_LAUNCH_LOGS=", launchDir);
      cmSystemTools::PutEnv(launchEnv);
    }
  }

  // If not using launchers, make sure they passthru.
  if (!this->Handler->UseCTestLaunch) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
}